

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4afdb9::EnclosingExpr::printLeft(EnclosingExpr *this,OutputStream *S)

{
  OutputStream::operator+=(S,this->Prefix);
  Node::print(this->Infix,S);
  OutputStream::operator+=(S,this->Postfix);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Prefix;
    Infix->print(S);
    S += Postfix;
  }